

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

BinsSelectConditionExprSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::BinsSelectConditionExprSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::NameSyntax&,slang::parsing::Token,slang::syntax::IntersectClauseSyntax*>
          (BumpAllocator *this,Token *args,Token *args_1,NameSyntax *args_2,Token *args_3,
          IntersectClauseSyntax **args_4)

{
  IntersectClauseSyntax *pIVar1;
  Info *pIVar2;
  Info *pIVar3;
  Info *pIVar4;
  TokenKind TVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  TokenKind TVar13;
  undefined1 uVar14;
  NumericTokenFlags NVar15;
  uint32_t uVar16;
  BinsSelectConditionExprSyntax *pBVar17;
  
  pBVar17 = (BinsSelectConditionExprSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8)
  ;
  if ((BinsSelectConditionExprSyntax *)this->endPtr < pBVar17 + 1) {
    pBVar17 = (BinsSelectConditionExprSyntax *)allocateSlow(this,0x58,8);
  }
  else {
    this->head->current = (byte *)(pBVar17 + 1);
  }
  TVar5 = args->kind;
  uVar6 = args->field_0x2;
  NVar7.raw = (args->numFlags).raw;
  uVar8 = args->rawLen;
  pIVar2 = args->info;
  TVar9 = args_1->kind;
  uVar10 = args_1->field_0x2;
  NVar11.raw = (args_1->numFlags).raw;
  uVar12 = args_1->rawLen;
  pIVar3 = args_1->info;
  TVar13 = args_3->kind;
  uVar14 = args_3->field_0x2;
  NVar15.raw = (args_3->numFlags).raw;
  uVar16 = args_3->rawLen;
  pIVar4 = args_3->info;
  pIVar1 = *args_4;
  (pBVar17->super_BinsSelectExpressionSyntax).super_SyntaxNode.kind = BinsSelectConditionExpr;
  (pBVar17->super_BinsSelectExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pBVar17->super_BinsSelectExpressionSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pBVar17->binsof).kind = TVar5;
  (pBVar17->binsof).field_0x2 = uVar6;
  (pBVar17->binsof).numFlags = (NumericTokenFlags)NVar7.raw;
  (pBVar17->binsof).rawLen = uVar8;
  (pBVar17->binsof).info = pIVar2;
  (pBVar17->openParen).kind = TVar9;
  (pBVar17->openParen).field_0x2 = uVar10;
  (pBVar17->openParen).numFlags = (NumericTokenFlags)NVar11.raw;
  (pBVar17->openParen).rawLen = uVar12;
  (pBVar17->openParen).info = pIVar3;
  (pBVar17->name).ptr = args_2;
  (pBVar17->closeParen).kind = TVar13;
  (pBVar17->closeParen).field_0x2 = uVar14;
  (pBVar17->closeParen).numFlags = (NumericTokenFlags)NVar15.raw;
  (pBVar17->closeParen).rawLen = uVar16;
  (pBVar17->closeParen).info = pIVar4;
  pBVar17->intersects = pIVar1;
  (args_2->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)pBVar17;
  if (pIVar1 != (IntersectClauseSyntax *)0x0) {
    (pIVar1->super_SyntaxNode).parent = (SyntaxNode *)pBVar17;
  }
  return pBVar17;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }